

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::InstrumentPass::GenUintCastCode
          (InstrumentPass *this,uint32_t val_id,InstructionBuilder *builder)

{
  IRContext *pIVar1;
  TypeManager *this_00;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  Instruction *pIVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  
  uVar2 = Gen32BitCvtCode(this,val_id,builder);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  this_00 = (pIVar1->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar5 = analysis::DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar2);
  uVar3 = 0;
  if (pIVar5->has_type_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
  }
  pTVar6 = analysis::TypeManager::GetType(this_00,uVar3);
  iVar4 = (*pTVar6->_vptr_Type[9])(pTVar6);
  if (*(char *)(CONCAT44(extraout_var,iVar4) + 0x28) == '\x01') {
    uVar3 = GetUintId(this);
    pIVar5 = InstructionBuilder::AddUnaryOp(builder,uVar3,OpBitcast,uVar2);
    uVar2 = 0;
    if (pIVar5->has_result_id_ == true) {
      uVar2 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

uint32_t InstrumentPass::GenUintCastCode(uint32_t val_id,
                                         InstructionBuilder* builder) {
  // Convert value to 32-bit if necessary
  uint32_t val_32b_id = Gen32BitCvtCode(val_id, builder);
  // Cast value to unsigned if necessary
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  uint32_t val_ty_id = get_def_use_mgr()->GetDef(val_32b_id)->type_id();
  analysis::Integer* val_ty = type_mgr->GetType(val_ty_id)->AsInteger();
  if (!val_ty->IsSigned()) return val_32b_id;
  return builder->AddUnaryOp(GetUintId(), spv::Op::OpBitcast, val_32b_id)
      ->result_id();
}